

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPSocket.cpp
# Opt level: O0

void uWS::HTTPSocket<false>::onData(Socket s,char *data,int length)

{
  Group<false> *this;
  UpgradeInfo __args_1;
  bool bVar1;
  uv_os_sock_t __fd;
  int iVar2;
  long lVar3;
  SocketData *pSVar4;
  uv_poll_t *webSocket;
  int in_EDX;
  ulong in_RSI;
  Socket in_RDI;
  WebSocketProtocol<false> *kws;
  size_t i_1;
  size_t i;
  HTTPParser httpParser;
  bool isUpgrade;
  int enable;
  size_t endOfHTTPBuffer;
  Data *httpData;
  HTTPSocket<false> httpSocket;
  void *in_stack_fffffffffffffeb8;
  Socket in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec8;
  undefined1 perMessageDeflate;
  Data *in_stack_fffffffffffffed0;
  uint length_00;
  char *in_stack_fffffffffffffed8;
  WebSocketProtocol<false> *in_stack_fffffffffffffee0;
  Data *pDVar5;
  char *in_stack_fffffffffffffee8;
  HTTPParser *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  string *psVar6;
  HTTPParser *in_stack_ffffffffffffff30;
  undefined1 local_c0 [8];
  Data *local_b8;
  function<void_(uWS::WebSocket<false>,_uWS::UpgradeInfo)> *local_b0;
  WebSocket<false> local_a8;
  uv_poll_t *local_a0;
  WebSocket<false> local_98 [3];
  ulong local_80;
  ulong local_78;
  char *local_68;
  ulong local_60;
  char *local_58;
  ulong local_50;
  byte local_45;
  undefined4 local_44;
  long local_40;
  uv_poll_t *local_38;
  Data *local_30;
  Socket local_20;
  int local_14;
  ulong local_10;
  Socket local_8;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8.p = in_RDI.p;
  HTTPSocket((HTTPSocket<false> *)&local_20,in_RDI);
  local_30 = getData((HTTPSocket<false> *)0x138920);
  lVar3 = std::__cxx11::string::length();
  if ((ulong)(lVar3 + local_14) < 0x1401) {
    std::__cxx11::string::append((char *)&local_30->httpBuffer,local_10);
    local_40 = std::__cxx11::string::find((char *)&local_30->httpBuffer,0x13a6be);
    if (local_40 != -1) {
      local_44 = 1;
      __fd = uS::Socket::getFd(&local_20);
      setsockopt(__fd,6,1,&local_44,4);
      psVar6 = &local_30->httpBuffer;
      std::__cxx11::string::length();
      std::__cxx11::string::resize((ulong)psVar6);
      local_45 = 0;
      std::__cxx11::string::data();
      HTTPParser::HTTPParser(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      HTTPParser::operator++(in_stack_ffffffffffffff30,(int)((ulong)psVar6 >> 0x20));
      while (perMessageDeflate = (undefined1)((ulong)in_stack_fffffffffffffec8 >> 0x38),
            local_60 != 0) {
        if (local_60 == 7) {
          for (local_78 = 0; local_78 < local_60; local_78 = local_78 + 1) {
            iVar2 = tolower((int)local_68[local_78]);
            local_68[local_78] = (char)iVar2;
          }
          for (local_80 = 0; local_80 < local_50; local_80 = local_80 + 1) {
            iVar2 = tolower((int)local_58[local_80]);
            local_58[local_80] = (char)iVar2;
          }
          iVar2 = strncmp(local_68,"upgrade",local_60);
          perMessageDeflate = (undefined1)((ulong)in_stack_fffffffffffffec8 >> 0x38);
          if (iVar2 == 0) {
            iVar2 = strncmp(local_58,"websocket",9);
            if (iVar2 == 0) {
              local_45 = 1;
            }
            break;
          }
        }
        HTTPParser::operator++(in_stack_ffffffffffffff30,(int)((ulong)psVar6 >> 0x20));
      }
      if ((local_45 & 1) == 0) {
        onEnd(in_stack_fffffffffffffec0);
      }
      else {
        operator_new(0xa0);
        WebSocket<false>::Data::Data
                  (in_stack_fffffffffffffed0,(bool)perMessageDeflate,
                   (SocketData *)in_stack_fffffffffffffec0.p);
        uS::Socket::enterState<uWS::WebSocket<false>>
                  ((Socket *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        uS::Socket::cancelTimeout((Socket *)in_stack_fffffffffffffed0);
        uS::Socket::setUserData((Socket *)in_stack_fffffffffffffec0.p,in_stack_fffffffffffffeb8);
        pSVar4 = uS::Socket::getSocketData(&local_8);
        this = (Group<false> *)pSVar4->nodeData;
        webSocket = uS::Socket::operator_cast_to_uv_poll_s_(&local_8);
        Group<false>::addWebSocket(this,webSocket);
        uS::Socket::getSocketData(&local_8);
        local_a0 = local_8.p;
        WebSocket<false>::WebSocket(local_98,local_8);
        memset(local_c0,0,0x20);
        __args_1.subprotocol = in_stack_fffffffffffffee8;
        __args_1.path = (char *)in_stack_fffffffffffffee0;
        __args_1.pathLength = (size_t)in_stack_fffffffffffffef0;
        __args_1.subprotocolLength._0_4_ = in_stack_fffffffffffffef8;
        __args_1.subprotocolLength._4_4_ = in_stack_fffffffffffffefc;
        std::function<void_(uWS::WebSocket<false>,_uWS::UpgradeInfo)>::operator()
                  (local_b0,local_a8,__args_1);
        length_00 = (uint)((ulong)local_a8.super_Socket.p >> 0x20);
        bVar1 = uS::Socket::isClosed((Socket *)0x138ce2);
        if ((!bVar1) && (bVar1 = uS::Socket::isShuttingDown((Socket *)0x138cf7), !bVar1)) {
          uS::Socket::getSocketData(&local_8);
          std::__cxx11::string::data();
          std::__cxx11::string::length();
          uS::Socket::operator_cast_to_uv_poll_s_(&local_8);
          WebSocketProtocol<false>::consume
                    (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,length_00,local_b0);
        }
        if (local_30 != (Data *)0x0) {
          pDVar5 = local_30;
          Data::~Data(local_b8);
          operator_delete(pDVar5);
        }
      }
    }
  }
  else {
    local_38 = local_8.p;
    onEnd(in_stack_fffffffffffffec0);
  }
  return;
}

Assistant:

void HTTPSocket<isServer>::onData(uS::Socket s, char *data, int length) {
    HTTPSocket httpSocket(s);
    HTTPSocket::Data *httpData = httpSocket.getData();

    // 5k = force close!
    if (httpData->httpBuffer.length() + length > 1024 * 5) {
        httpSocket.onEnd(s);
        return;
    }

    httpData->httpBuffer.append(data, length);

    size_t endOfHTTPBuffer = httpData->httpBuffer.find("\r\n\r\n");
    if (endOfHTTPBuffer != std::string::npos) {

        int enable = 1;
        setsockopt(httpSocket.getFd(), IPPROTO_TCP, TCP_NODELAY, &enable, sizeof(enable));

        if (isServer) {

            HTTPParser httpParser = (char *) httpData->httpBuffer.data();
            std::pair<char *, size_t> secKey = {}, extensions = {}, subprotocol = {}, path = httpParser.value;
            for (httpParser++; httpParser.key.second; httpParser++) {
                if (httpParser.key.second == 17 || httpParser.key.second == 24 || httpParser.key.second == 22) {
                    // lowercase the key
                    for (size_t i = 0; i < httpParser.key.second; i++) {
                        httpParser.key.first[i] = tolower(httpParser.key.first[i]);
                    }
                    if (!strncmp(httpParser.key.first, "sec-websocket-key", httpParser.key.second)) {
                        secKey = httpParser.value;
                    } else if (!strncmp(httpParser.key.first, "sec-websocket-extensions", httpParser.key.second)) {
                        extensions = httpParser.value;
                    } else if (!strncmp(httpParser.key.first, "sec-websocket-protocol", httpParser.key.second)) {
                        subprotocol = httpParser.value;
                    }
                }
            }

            if (secKey.first && secKey.second == 24) {

                // this needs to be part of upgrade itself, and shared with Hub::upgrade!
                bool perMessageDeflate = false;
                std::string extensionsResponse;
                if (extensions.first) {
                    Group<isServer> *group = (Group<isServer> *) s.getNodeData(s.getSocketData());
                    ExtensionsNegotiator<uWS::SERVER> extensionsNegotiator(group->extensionOptions);
                    extensionsNegotiator.readOffer(std::string(extensions.first, extensions.second));
                    extensionsResponse = extensionsNegotiator.generateOffer();
                    if (extensionsNegotiator.getNegotiatedOptions() & PERMESSAGE_DEFLATE) {
                        perMessageDeflate = true;
                    }
                }

                if (httpSocket.upgrade(secKey.first, extensionsResponse.data(), extensionsResponse.length(), subprotocol.first, subprotocol.second)) {
                    s.cancelTimeout();
                    s.enterState<WebSocket<SERVER>>(new WebSocket<SERVER>::Data(perMessageDeflate, httpData));

                    ((Group<SERVER> *) s.getSocketData()->nodeData)->addWebSocket(s);
                    //s.cork(true);
                    ((Group<SERVER> *) s.getSocketData()->nodeData)->connectionHandler(WebSocket<SERVER>(s), {path.first, subprotocol.first,
                                                                                                              path.second, subprotocol.second});
                    //s.cork(false);
                    delete httpData;
                }
            } else {
                httpSocket.onEnd(s);
            }
        } else {
            httpData->httpBuffer.resize(httpData->httpBuffer.length() + WebSocketProtocol<uWS::CLIENT>::CONSUME_POST_PADDING);

            bool isUpgrade = false;
            HTTPParser httpParser = (char *) httpData->httpBuffer.data();
            //std::pair<char *, size_t> secKey = {}, extensions = {};
            for (httpParser++; httpParser.key.second; httpParser++) {
                if (httpParser.key.second == 7) {
                    // lowercase the key
                    for (size_t i = 0; i < httpParser.key.second; i++) {
                        httpParser.key.first[i] = tolower(httpParser.key.first[i]);
                    }
                    // lowercase the value
                    for (size_t i = 0; i < httpParser.value.second; i++) {
                        httpParser.value.first[i] = tolower(httpParser.value.first[i]);
                    }
                    if (!strncmp(httpParser.key.first, "upgrade", httpParser.key.second)) {
                        if (!strncmp(httpParser.value.first, "websocket", 9)) {
                            isUpgrade = true;
                        }
                        break;
                    }
                }
            }

            if (isUpgrade) {
                s.enterState<WebSocket<CLIENT>>(new WebSocket<CLIENT>::Data(false, httpData));

                //s.cork(true);
                httpSocket.cancelTimeout();
                httpSocket.setUserData(httpData->httpUser);
                ((Group<CLIENT> *) s.getSocketData()->nodeData)->addWebSocket(s);
                ((Group<CLIENT> *) s.getSocketData()->nodeData)->connectionHandler(WebSocket<CLIENT>(s), {nullptr, nullptr, 0, 0});
                //s.cork(false);

                if (!(s.isClosed() || s.isShuttingDown())) {
                    WebSocketProtocol<CLIENT> *kws = (WebSocketProtocol<CLIENT> *) ((WebSocket<CLIENT>::Data *) s.getSocketData());
                    kws->consume((char *) httpData->httpBuffer.data() + endOfHTTPBuffer + 4, httpData->httpBuffer.length() - endOfHTTPBuffer - 4 - WebSocketProtocol<uWS::CLIENT>::CONSUME_POST_PADDING, s);
                }

                delete httpData;
            } else {
                httpSocket.onEnd(s);
            }
        }
    }
}